

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O1

void av1_update_rd_thresh_fact
               (AV1_COMMON *cm,int (*factor_buf) [169],int use_adaptive_rd_thresh,BLOCK_SIZE bsize,
               THR_MODES best_mode_index,THR_MODES inter_mode_start,THR_MODES inter_mode_end,
               THR_MODES intra_mode_start,THR_MODES intra_mode_end)

{
  BLOCK_SIZE BVar1;
  uint uVar2;
  BLOCK_SIZE BVar3;
  BLOCK_SIZE BVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  BVar1 = cm->seq_params->sb_size;
  BVar4 = bsize;
  if (bsize <= BVar1) {
    BVar3 = BLOCK_8X4;
    if (BLOCK_8X4 < bsize) {
      BVar3 = bsize;
    }
    uVar2 = (uint)bsize;
    bsize = (BLOCK_SIZE)(uVar2 + 2);
    BVar4 = BVar3 - BLOCK_8X4;
    if ((uint)BVar1 <= uVar2 + 2) {
      bsize = BVar1;
    }
  }
  iVar5 = use_adaptive_rd_thresh * 0x40;
  if (inter_mode_start < inter_mode_end) {
    uVar7 = (ulong)inter_mode_start;
    BVar1 = BVar4;
    do {
      for (; BVar1 <= bsize; BVar1 = BVar1 + BLOCK_4X8) {
        iVar6 = factor_buf[BVar1][uVar7];
        if (uVar7 == best_mode_index) {
          iVar6 = iVar6 - (iVar6 >> 4);
        }
        else {
          iVar6 = iVar6 + 1;
          if (SBORROW4(iVar6,iVar5) == iVar6 + use_adaptive_rd_thresh * -0x40 < 0) {
            iVar6 = iVar5;
          }
        }
        factor_buf[BVar1][uVar7] = iVar6;
      }
      uVar7 = uVar7 + 1;
      BVar1 = BVar4;
    } while (uVar7 != inter_mode_end);
  }
  if (intra_mode_start < intra_mode_end) {
    uVar7 = (ulong)intra_mode_start;
    BVar1 = BVar4;
    do {
      for (; BVar1 <= bsize; BVar1 = BVar1 + BLOCK_4X8) {
        iVar6 = factor_buf[BVar1][uVar7];
        if (uVar7 == best_mode_index) {
          iVar6 = iVar6 - (iVar6 >> 4);
        }
        else {
          iVar6 = iVar6 + 1;
          if (SBORROW4(iVar6,iVar5) == iVar6 + use_adaptive_rd_thresh * -0x40 < 0) {
            iVar6 = iVar5;
          }
        }
        factor_buf[BVar1][uVar7] = iVar6;
      }
      uVar7 = uVar7 + 1;
      BVar1 = BVar4;
    } while (uVar7 != intra_mode_end);
  }
  return;
}

Assistant:

void av1_update_rd_thresh_fact(
    const AV1_COMMON *const cm, int (*factor_buf)[MAX_MODES],
    int use_adaptive_rd_thresh, BLOCK_SIZE bsize, THR_MODES best_mode_index,
    THR_MODES inter_mode_start, THR_MODES inter_mode_end,
    THR_MODES intra_mode_start, THR_MODES intra_mode_end) {
  assert(use_adaptive_rd_thresh > 0);
  const int max_rd_thresh_factor = use_adaptive_rd_thresh * RD_THRESH_MAX_FACT;

  const int bsize_is_1_to_4 = bsize > cm->seq_params->sb_size;
  BLOCK_SIZE min_size, max_size;
  if (bsize_is_1_to_4) {
    // This part handles block sizes with 1:4 and 4:1 aspect ratios
    // TODO(any): Experiment with threshold update for parent/child blocks
    min_size = bsize;
    max_size = bsize;
  } else {
    min_size = AOMMAX(bsize - 2, BLOCK_4X4);
    max_size = AOMMIN(bsize + 2, (int)cm->seq_params->sb_size);
  }

  update_thr_fact(factor_buf, best_mode_index, inter_mode_start, inter_mode_end,
                  min_size, max_size, max_rd_thresh_factor);
  update_thr_fact(factor_buf, best_mode_index, intra_mode_start, intra_mode_end,
                  min_size, max_size, max_rd_thresh_factor);
}